

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_RemoveTabCommand(char *name)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TabData *pTVar4;
  uint local_18;
  FName local_14;
  uint i;
  FName aname;
  char *name_local;
  
  _i = name;
  FName::FName(&local_14,name,true);
  bVar1 = FName::operator==(&local_14,NAME_None);
  if (!bVar1) {
    for (local_18 = 0; uVar2 = TArray<TabData,_TabData>::Size(&TabCommands), local_18 < uVar2;
        local_18 = local_18 + 1) {
      pTVar4 = TArray<TabData,_TabData>::operator[](&TabCommands,(ulong)local_18);
      bVar1 = FName::operator==(&pTVar4->TabName,&local_14);
      if (bVar1) {
        pTVar4 = TArray<TabData,_TabData>::operator[](&TabCommands,(ulong)local_18);
        iVar3 = pTVar4->UseCount + -1;
        pTVar4->UseCount = iVar3;
        if (iVar3 != 0) {
          return;
        }
        TArray<TabData,_TabData>::Delete(&TabCommands,local_18);
        return;
      }
    }
  }
  return;
}

Assistant:

void C_RemoveTabCommand (const char *name)
{
	FName aname(name, true);

	if (aname == NAME_None)
	{
		return;
	}
	for (unsigned int i = 0; i < TabCommands.Size(); ++i)
	{
		if (TabCommands[i].TabName == aname)
		{
			if (--TabCommands[i].UseCount == 0)
			{
				TabCommands.Delete(i);
			}
			break;
		}
	}
}